

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

module __thiscall pybind11::module::def_submodule(module *this,char *name,char *doc)

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  PyObject *ptr;
  char *in_RCX;
  str_attr_accessor local_140;
  str_attr_accessor local_120;
  str local_100;
  handle local_f8;
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [8];
  string full_name;
  char *doc_local;
  char *name_local;
  module *this_local;
  module *result;
  
  pcVar2 = (char *)PyModule_GetName(*(undefined8 *)name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,pcVar2,&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,".",&local_c1);
  std::operator+(local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,doc,&local_e9);
  std::operator+(local_48,local_68);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_ea = 0;
  uVar3 = std::__cxx11::string::c_str();
  ptr = (PyObject *)PyImport_AddModule(uVar3);
  handle::handle(&local_f8,ptr);
  reinterpret_borrow<pybind11::module>((pybind11 *)this,local_f8);
  if ((in_RCX != (char *)0x0) && (bVar1 = options::show_user_defined_docstrings(), bVar1)) {
    str::str(&local_100,in_RCX);
    detail::object_api<pybind11::handle>::attr
              (&local_120,(object_api<pybind11::handle> *)this,"__doc__");
    detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              (&local_120,&local_100);
    detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_120);
    str::~str(&local_100);
  }
  detail::object_api<pybind11::handle>::attr(&local_140,(object_api<pybind11::handle> *)name,doc);
  detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_140,this);
  detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_140);
  local_ea = 1;
  std::__cxx11::string::~string((string *)local_48);
  return (object)(object)this;
}

Assistant:

module def_submodule(const char *name, const char *doc = nullptr) {
        std::string full_name = std::string(PyModule_GetName(m_ptr))
            + std::string(".") + std::string(name);
        auto result = reinterpret_borrow<module>(PyImport_AddModule(full_name.c_str()));
        if (doc && options::show_user_defined_docstrings())
            result.attr("__doc__") = pybind11::str(doc);
        attr(name) = result;
        return result;
    }